

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffdkey(fitsfile *fptr,char *keyname,int *status)

{
  char *__s;
  FITSfile *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  size_t sVar5;
  char message [81];
  char value [71];
  char valstring [71];
  char comm [73];
  char local_178 [95];
  char acStack_119 [81];
  char local_c8 [80];
  char local_78 [80];
  
  if (0 < *status) {
    return *status;
  }
  iVar3 = ffgkey(fptr,keyname,local_c8,local_78,status);
  if (iVar3 < 1) {
    pFVar1 = fptr->Fptr;
    auVar2 = SEXT816(pFVar1->nextkey - pFVar1->headstart[pFVar1->curhdu]) *
             SEXT816(0x6666666666666667);
    iVar3 = (int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f);
    ffdrec(fptr,iVar3,status);
    if (0 < *status) {
      return *status;
    }
    ffpmrk();
    ffc2s(local_c8,acStack_119 + 1,status);
    if (*status == 0xcc) {
      ffcmrk();
      *status = 0;
    }
    else {
      __s = acStack_119 + 1;
      sVar5 = strlen(__s);
      iVar4 = (int)sVar5;
      while ((iVar4 != 0 && (__s[(long)(int)sVar5 + -1] == '&'))) {
        local_178[0] = '\0';
        ffgcnt(fptr,__s,local_178,status);
        sVar5 = 0;
        if (local_178[0] != '\0' || acStack_119[1] != '\0') {
          ffdrec(fptr,iVar3,status);
          sVar5 = strlen(__s);
        }
        iVar4 = (int)sVar5;
      }
    }
  }
  else {
    snprintf(local_178,0x51,"Could not find the %s keyword to delete (ffdkey)",keyname);
    ffpmsg(local_178);
  }
  return *status;
}

Assistant:

int ffdkey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, comm, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                keyname);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        nextcomm[0]='\0';
        ffgcnt(fptr, value, nextcomm, status);
        if (*value || strlen(nextcomm))
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}